

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_node **ppsVar1;
  stbrp_rect *psVar2;
  int iVar3;
  stbrp_node *psVar4;
  undefined1 auVar5 [16];
  stbrp_node **ppsVar6;
  stbrp_context *psVar7;
  uint uVar8;
  stbrp_node *in_RAX;
  stbrp_node *extraout_RAX;
  stbrp_node *extraout_RAX_00;
  uint uVar9;
  int iVar10;
  int *piVar11;
  stbrp_node *psVar12;
  stbrp_node *psVar13;
  stbrp_node **ppsVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  stbrp_rect *psVar18;
  int iVar19;
  int iVar20;
  int x0;
  size_t __nmemb;
  uint uVar21;
  stbrp_context *psVar22;
  ulong uVar23;
  stbrp_context *c;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int waste;
  uint local_a4;
  uint local_a0;
  int local_9c;
  stbrp_node **local_98;
  int local_68;
  int local_64;
  stbrp_node *local_60;
  ulong local_58;
  stbrp_rect *local_50;
  stbrp_node *local_48;
  size_t local_40;
  ulong local_38;
  
  auVar5 = _DAT_001e93b0;
  uVar23 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    in_RAX = (stbrp_node *)(ulong)(num_rects + 1U & 0xfffffffe);
    lVar16 = uVar23 - 1;
    auVar24._8_4_ = (int)lVar16;
    auVar24._0_8_ = lVar16;
    auVar24._12_4_ = (int)((ulong)lVar16 >> 0x20);
    piVar11 = &rects->was_packed;
    psVar13 = (stbrp_node *)0x0;
    auVar24 = auVar24 ^ _DAT_001e93b0;
    auVar25 = _DAT_001e96a0;
    do {
      auVar26 = auVar25 ^ auVar5;
      if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                  auVar24._4_4_ < auVar26._4_4_) & 1)) {
        *piVar11 = (int)psVar13;
      }
      if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
          auVar26._12_4_ <= auVar24._12_4_) {
        piVar11[6] = (int)psVar13 + 1;
      }
      psVar13 = (stbrp_node *)((long)&psVar13->x + 2);
      lVar16 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar16 + 2;
      piVar11 = piVar11 + 0xc;
    } while (in_RAX != psVar13);
  }
  __nmemb = (size_t)num_rects;
  if (1 < (uint)num_rects) {
    qsort(rects,__nmemb,0x18,rect_height_compare);
    in_RAX = extraout_RAX;
  }
  local_40 = __nmemb;
  local_38 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    ppsVar1 = &context->active_head;
    uVar15 = 0;
    local_58 = uVar23;
    local_50 = rects;
    do {
      psVar2 = rects + uVar15;
      uVar8 = psVar2->w;
      in_RAX = (stbrp_node *)(ulong)uVar8;
      lVar16 = 0xc;
      lVar17 = 0x10;
      if ((uVar8 == 0) || (iVar19 = psVar2->h, iVar19 == 0)) {
        uVar8 = 0;
        uVar9 = 0;
      }
      else {
        iVar3 = context->width;
        iVar10 = context->align;
        iVar20 = uVar8 + iVar10 + -1;
        x0 = iVar20 - iVar20 % iVar10;
        psVar13 = (stbrp_node *)((long)iVar20 / (long)iVar10 & 0xffffffff);
        local_48 = in_RAX;
        if (x0 <= iVar3) {
          uVar9 = context->height;
          psVar13 = (stbrp_node *)(ulong)uVar9;
          if (iVar19 <= (int)uVar9) {
            c = (stbrp_context *)*ppsVar1;
            uVar21 = c->width;
            psVar13 = (stbrp_node *)(ulong)uVar21;
            uVar8 = uVar21 + x0;
            psVar18 = psVar2;
            if (iVar3 < (int)uVar8) {
              iVar10 = context->heuristic;
              local_98 = (stbrp_node **)0x0;
              local_a4 = 0x40000000;
              local_9c = 0x40000000;
              local_a0 = 0;
            }
            else {
              local_a4 = 0x40000000;
              local_98 = (stbrp_node **)0x0;
              local_9c = 0x40000000;
              ppsVar14 = ppsVar1;
              psVar22 = c;
              local_60 = psVar13;
              do {
                uVar8 = stbrp__skyline_find_min_y(psVar22,psVar13,x0,(int)&local_64,&psVar18->id);
                iVar10 = context->heuristic;
                if (iVar10 == 0) {
                  if ((int)uVar8 < (int)local_a4) {
                    local_a4 = uVar8;
                    local_98 = ppsVar14;
                  }
                }
                else if (((int)(iVar19 + uVar8) <= (int)uVar9) &&
                        (((int)uVar8 < (int)local_a4 || (local_64 < local_9c && uVar8 == local_a4)))
                        ) {
                  local_9c = local_64;
                  local_a4 = uVar8;
                  local_98 = ppsVar14;
                }
                ppsVar14 = (stbrp_node **)&psVar22->align;
                uVar8 = (*(stbrp_context **)&psVar22->align)->width;
                psVar13 = (stbrp_node *)(ulong)uVar8;
                uVar8 = uVar8 + x0;
                psVar22 = *(stbrp_context **)&psVar22->align;
              } while ((int)uVar8 <= iVar3);
              if (local_98 == (stbrp_node **)0x0) {
                local_98 = (stbrp_node **)0x0;
                local_a0 = 0;
              }
              else {
                uVar8 = (*local_98)->x;
                local_a0 = uVar8;
              }
              uVar21 = (uint)local_60;
            }
            psVar22 = c;
            if (iVar10 == 1) {
              while (ppsVar14 = ppsVar1, (int)uVar21 < x0) {
                uVar21 = (*(stbrp_context **)&psVar22->align)->width;
                psVar22 = *(stbrp_context **)&psVar22->align;
              }
              do {
                uVar21 = psVar22->width - x0;
                ppsVar6 = ppsVar14;
                psVar7 = c;
                do {
                  c = psVar7;
                  ppsVar14 = ppsVar6;
                  ppsVar6 = (stbrp_node **)&c->align;
                  psVar7 = *(stbrp_context **)&c->align;
                } while ((*(stbrp_context **)&c->align)->width <= (int)uVar21);
                uVar8 = stbrp__skyline_find_min_y
                                  (c,(stbrp_node *)(ulong)uVar21,x0,(int)&local_68,&psVar18->id);
                if ((((int)(iVar19 + uVar8) <= (int)uVar9) && ((int)uVar8 <= (int)local_a4)) &&
                   (((uVar8 < local_a4 || (local_68 < local_9c)) ||
                    ((local_68 == local_9c && ((int)uVar21 < (int)local_a0)))))) {
                  local_9c = local_68;
                  local_a4 = uVar8;
                  local_a0 = uVar21;
                  local_98 = ppsVar14;
                }
                psVar22 = *(stbrp_context **)&psVar22->align;
              } while (psVar22 != (stbrp_context *)0x0);
            }
            psVar13 = (stbrp_node *)(ulong)uVar8;
            rects = local_50;
            uVar23 = local_58;
            if (local_98 != (stbrp_node **)0x0) {
              uVar21 = iVar19 + local_a4;
              in_RAX = (stbrp_node *)(ulong)uVar21;
              lVar16 = 0xc;
              lVar17 = 0x10;
              uVar8 = 0x7fffffff;
              if ((int)uVar9 < (int)uVar21) {
                uVar9 = 0x7fffffff;
              }
              else {
                in_RAX = context->free_head;
                uVar9 = 0x7fffffff;
                if (in_RAX != (stbrp_node *)0x0) {
                  in_RAX->x = local_a0;
                  in_RAX->y = uVar21;
                  context->free_head = in_RAX->next;
                  psVar13 = *local_98;
                  psVar12 = psVar13;
                  if (psVar13->x < (int)local_a0) {
                    psVar12 = psVar13->next;
                    local_98 = &psVar13->next;
                  }
                  *local_98 = in_RAX;
                  iVar19 = (int)local_48 + local_a0;
                  psVar13 = psVar12->next;
                  while ((psVar4 = psVar13, psVar4 != (stbrp_node *)0x0 && (psVar4->x <= iVar19))) {
                    psVar12->next = context->free_head;
                    context->free_head = psVar12;
                    psVar12 = psVar4;
                    psVar13 = psVar4->next;
                  }
                  in_RAX->next = psVar12;
                  lVar16 = 0x10;
                  lVar17 = 0xc;
                  uVar8 = local_a0;
                  uVar9 = local_a4;
                  if (psVar12->x < iVar19) {
                    psVar12->x = iVar19;
                  }
                }
              }
              goto LAB_001a6a91;
            }
          }
        }
        in_RAX = psVar13;
        lVar17 = 0x10;
        lVar16 = 0xc;
        uVar8 = 0x7fffffff;
        uVar9 = 0x7fffffff;
      }
LAB_001a6a91:
      *(uint *)((long)&psVar2->id + lVar17) = uVar8;
      *(uint *)((long)&psVar2->id + lVar16) = uVar9;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar23);
  }
  uVar8 = (uint)local_38;
  if (1 < uVar8) {
    qsort(rects,local_40,0x18,rect_original_order);
    in_RAX = extraout_RAX_00;
  }
  if (0 < (int)uVar8) {
    in_RAX = (stbrp_node *)(uVar23 * 0x18);
    lVar16 = 0;
    do {
      uVar8 = 1;
      if (*(int *)((long)&rects->x + lVar16) == 0x7fffffff) {
        uVar8 = (uint)(*(int *)((long)&rects->y + lVar16) != 0x7fffffff);
      }
      *(uint *)((long)&rects->was_packed + lVar16) = uVar8;
      lVar16 = lVar16 + 0x18;
    } while (in_RAX != (stbrp_node *)lVar16);
  }
  return (int)in_RAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}